

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

void __thiscall anon_func::WriteUpdater::~WriteUpdater(WriteUpdater *this)

{
  ::wasm::WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>::
  ~WalkerPass(&this->
               super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
             );
  operator_delete(this,0x130);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }